

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 *out_b;
  size_t __n;
  long lVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 __src;
  uint uVar11;
  ImU32 IVar12;
  ImU32 IVar13;
  int iVar14;
  undefined8 extraout_RAX;
  undefined7 uVar16;
  char *text_end;
  void *pvVar15;
  undefined7 extraout_var;
  byte bVar17;
  ImVec2 *out_r;
  long lVar18;
  ImDrawList *this;
  ImGuiContext *g;
  uint uVar19;
  bool bVar20;
  uint uVar21;
  int iVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ImVec2 IVar24;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  ImVec2 pos_00;
  float extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  int iVar27;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  uint extraout_XMM0_Dd;
  undefined1 extraout_var_00 [12];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  int iVar28;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float V;
  ImVec2 current_off_unrotated;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float vv;
  float uu;
  ImVec2 picker_pos;
  float ww;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  ImVec4 local_1c8;
  ImVec2 local_1b8;
  uint local_1b0;
  float local_1ac;
  ImVec2 local_1a8;
  ImVec2 local_1a0;
  float local_198;
  float fStack_194;
  uint uStack_190;
  uint uStack_18c;
  ImVec2 local_188;
  ImVec2 *local_170;
  ImVec2 local_168;
  undefined1 local_160 [8];
  ImVec2 local_158;
  ImVec2 local_150;
  float local_148;
  float fStack_144;
  uint uStack_140;
  uint uStack_13c;
  ImVec2 local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  ImDrawList *local_f8;
  ImVec2 local_f0;
  undefined1 local_e8 [16];
  ImU32 local_d0;
  uint local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  ImGuiWindow *local_a0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  uint uStack_70;
  uint uStack_6c;
  size_t local_60;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar30 [16];
  
  pIVar6 = GImGui;
  local_e8._8_8_ = local_e8._0_8_;
  local_e8._0_8_ = ref_col;
  local_a0 = GImGui->CurrentWindow;
  local_a0->WriteAccessed = true;
  local_f8 = local_a0->DrawList;
  PushID(label);
  BeginGroup();
  uVar19 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar19);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar11 = pIVar6->ColorEditOptions & 0x6000000;
    uVar21 = 0x2000000;
    if (uVar11 != 0) {
      uVar21 = uVar11;
    }
    uVar19 = uVar19 | uVar21;
  }
  if ((uVar19 & 8) == 0) {
    uVar19 = uVar19 | pIVar6->ColorEditOptions & 0x10000U;
  }
  local_1b0 = uVar19 & 0x10002;
  bVar20 = local_1b0 == 0x10000;
  IVar24 = (local_a0->DC).CursorPos;
  local_170 = (ImVec2 *)col;
  local_130 = IVar24;
  local_148 = GetFrameHeight();
  fStack_144 = extraout_XMM0_Db;
  uStack_140 = extraout_XMM0_Dc;
  uStack_13c = extraout_XMM0_Dd;
  fVar23 = CalcItemWidth();
  out_r = local_170;
  fVar38 = (pIVar6->Style).ItemInnerSpacing.x;
  local_118 = ZEXT416((uint)fVar38);
  fVar23 = fVar23 - (local_148 + fVar38) * (float)(byte)(bVar20 + 1);
  uVar21 = -(uint)(fVar23 <= local_148);
  fStack_194 = (float)(extraout_var_00._0_4_ & (uint)fStack_144);
  uStack_190 = extraout_var_00._4_4_ & uStack_140;
  uStack_18c = extraout_var_00._8_4_ & uStack_13c;
  local_198 = (float)(uVar21 & (uint)local_148 | ~uVar21 & (uint)fVar23);
  __n = (ulong)((uVar19 & 2) == 0) * 4 + 0xc;
  memcpy(local_58,local_170,__n);
  local_210 = local_198 * 0.08;
  local_88 = ZEXT416((uint)(local_198 * 0.5));
  local_1a0.x = local_198 * 0.5 - local_210;
  _local_b8 = ZEXT416((uint)local_1a0.x);
  local_1ac = IVar24.x;
  local_78 = local_198 + local_1ac;
  fStack_74 = fStack_194;
  uStack_70 = uStack_190;
  uStack_6c = uStack_18c;
  local_1f8._4_4_ = local_118._4_4_;
  local_1f8._0_4_ = (float)local_118._0_4_ + local_78;
  fStack_1f0 = (float)local_118._8_4_;
  fStack_1ec = (float)local_118._12_4_;
  local_208._4_4_ = fStack_144;
  local_208._0_4_ = local_148 + (float)local_118._0_4_ + local_78;
  fStack_200 = (float)uStack_140;
  fStack_1fc = (float)uStack_13c;
  _fStack_1e0 = 0;
  local_1e8._0_4_ = IVar24.x;
  local_1e8._4_4_ = IVar24.y;
  fVar38 = (local_148 + local_198) * 0.5 + local_1ac;
  fVar23 = local_198 * 0.5 + IVar24.y;
  fStack_100 = fStack_144 * 0.0 + 0.0;
  fStack_fc = fStack_194 * 0.0 + 0.0;
  local_108 = (ImVec2 *)CONCAT44(fVar23,fVar38);
  local_1b8.y = fVar23;
  local_1b8.x = fVar38;
  local_1a0.x = local_1a0.x - (float)(int)(local_198 * 0.027);
  local_1a0.y = 0.0;
  local_150.x = local_1a0.x * -0.5;
  local_150.y = local_1a0.x * -0.866025;
  local_1a8.y = local_1a0.x * 0.866025;
  local_1a8.x = local_150.x;
  ColorConvertRGBtoHSV(out_r->x,out_r->y,out_r[1].x,&local_218,&local_214,&local_20c);
  PushItemFlag(8,true);
  local_188 = (ImVec2)pIVar6;
  uVar16 = (undefined7)((ulong)pIVar6 >> 8);
  if ((uVar19 >> 0x1a & 1) == 0) {
    if ((uVar19 >> 0x19 & 1) == 0) {
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_128._4_12_;
      local_128 = auVar4 << 0x20;
      uVar21 = 0;
      local_1d8._0_4_ = 0;
    }
    else {
      local_1c8.y = local_198;
      local_1c8.x = local_198;
      InvisibleButton("sv",(ImVec2 *)&local_1c8);
      bVar20 = IsItemActive();
      if (bVar20) {
        auVar29._0_4_ = local_198 + -1.0;
        auVar25._0_4_ = (*(ImVec2 *)((long)local_188 + 0x130)).x - (float)local_1e8._0_4_;
        auVar25._4_4_ = (*(ImVec2 *)((long)local_188 + 0x130)).y - (float)local_1e8._4_4_;
        auVar25._8_4_ = 0.0 - fStack_1e0;
        auVar25._12_4_ = 0.0 - fStack_1dc;
        auVar29._4_4_ = auVar29._0_4_;
        auVar29._8_4_ = auVar29._0_4_;
        auVar29._12_4_ = auVar29._0_4_;
        auVar26 = divps(auVar25,auVar29);
        fVar38 = auVar26._4_4_;
        iVar14 = -(uint)(1.0 < auVar26._0_4_);
        iVar22 = -(uint)(1.0 < fVar38);
        auVar31._4_4_ = iVar22;
        auVar31._0_4_ = iVar14;
        auVar31._8_4_ = iVar22;
        auVar31._12_4_ = iVar22;
        auVar30._8_8_ = auVar31._8_8_;
        auVar30._4_4_ = iVar14;
        auVar30._0_4_ = iVar14;
        uVar21 = movmskpd(local_188.x,auVar30);
        auVar37 = ZEXT816(0x3f800000);
        if ((uVar21 & 1) == 0) {
          auVar37 = auVar26;
        }
        local_214 = (float)(~-(uint)(auVar26._0_4_ < 0.0) & auVar37._0_4_);
        fVar23 = 0.0;
        if ((uVar21 & 2) == 0) {
          fVar23 = 1.0 - fVar38;
        }
        local_20c = (float)(-(uint)(fVar38 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar38 < 0.0) & (uint)fVar23);
        local_128._0_4_ = (int)CONCAT71((uint7)(uint3)(uVar21 >> 8),1);
      }
      else {
        auVar5._12_4_ = 0;
        auVar5._0_12_ = local_128._4_12_;
        local_128 = auVar5 << 0x20;
      }
      if ((uVar19 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_1c8.y = (float)local_1e8._4_4_;
      local_1c8.x = (float)local_1f8._0_4_;
      SetCursorScreenPos((ImVec2 *)&local_1c8);
      local_1c8.y = local_198;
      local_1c8.x = local_148;
      InvisibleButton("hue",(ImVec2 *)&local_1c8);
      bVar20 = IsItemActive();
      if (bVar20) {
        fVar38 = (*(float *)((long)local_188 + 0x134) - (float)local_1e8._4_4_) / (local_198 + -1.0)
        ;
        local_218 = 1.0;
        if (fVar38 <= 1.0) {
          local_218 = fVar38;
        }
        local_218 = (float)(~-(uint)(fVar38 < 0.0) & (uint)local_218);
        uVar21 = (uint)CONCAT71(uVar16,1);
        local_1d8._0_4_ = (undefined4)CONCAT71(local_188._1_7_,1);
      }
      else {
        uVar21 = 0;
        local_1d8._0_4_ = local_128._0_4_;
      }
    }
  }
  else {
    local_1c8.y = local_198;
    local_1c8.x = (pIVar6->Style).ItemInnerSpacing.x + local_198 + local_148;
    InvisibleButton("hsv",(ImVec2 *)&local_1c8);
    bVar20 = IsItemActive();
    if (bVar20) {
      fVar39 = (pIVar6->IO).MouseClickedPos[0].x - (float)local_108;
      fVar40 = (pIVar6->IO).MouseClickedPos[0].y - local_108._4_4_;
      local_1d8 = ZEXT416((uint)fVar40);
      fVar23 = (pIVar6->IO).MousePos.x - (float)local_108;
      local_c8 = ZEXT416((uint)fVar23);
      fVar38 = (pIVar6->IO).MousePos.y - local_108._4_4_;
      _local_98 = ZEXT416((uint)fVar38);
      local_128 = ZEXT416((uint)fVar39);
      fVar40 = fVar39 * fVar39 + fVar40 * fVar40;
      if ((fVar40 < ((float)local_b8._0_4_ + -1.0) * ((float)local_b8._0_4_ + -1.0)) ||
         (((float)local_88._0_4_ + 1.0) * ((float)local_88._0_4_ + 1.0) < fVar40)) {
        uVar21 = 0;
      }
      else {
        fVar38 = atan2f(fVar38,fVar23);
        fVar38 = (fVar38 / 3.1415927) * 0.5;
        local_218 = (float)(~-(uint)(fVar38 < 0.0) & (uint)fVar38 |
                           (uint)(fVar38 + 1.0) & -(uint)(fVar38 < 0.0));
        uVar21 = (uint)CONCAT71(uVar16,1);
      }
      fVar38 = cosf(local_218 * -2.0 * 3.1415927);
      local_108 = (ImVec2 *)CONCAT44(extraout_XMM0_Db_00,fVar38);
      fStack_100 = extraout_XMM0_Dc_00;
      fStack_fc = extraout_XMM0_Dd_00;
      fVar38 = sinf(local_218 * -2.0 * 3.1415927);
      fVar23 = -(float)local_1d8._0_4_;
      fVar40 = (float)local_108 * (float)local_1d8._0_4_;
      local_1d8._4_4_ = extraout_XMM0_Db_01;
      local_1d8._0_4_ = fVar38;
      local_1d8._8_4_ = extraout_XMM0_Dc_01;
      local_1d8._12_4_ = extraout_XMM0_Dd_01;
      local_1c8.x = (float)local_108 * (float)local_128._0_4_ + fVar23 * fVar38;
      local_1c8.y = fVar38 * (float)local_128._0_4_ + fVar40;
      bVar20 = ImTriangleContainsPoint(&local_1a0,&local_150,&local_1a8,(ImVec2 *)&local_1c8);
      if (bVar20) {
        local_1c8.x = (float)local_108 * (float)local_c8._0_4_ +
                      -(float)local_98._0_4_ * (float)local_1d8._0_4_;
        local_1c8.y = (float)local_1d8._0_4_ * (float)local_c8._0_4_ +
                      (float)local_108 * (float)local_98._0_4_;
        bVar20 = ImTriangleContainsPoint(&local_1a0,&local_150,&local_1a8,(ImVec2 *)&local_1c8);
        if (!bVar20) {
          local_1c8._0_8_ =
               ImTriangleClosestPoint(&local_1a0,&local_150,&local_1a8,(ImVec2 *)&local_1c8);
        }
        ImTriangleBarycentricCoords
                  (&local_1a0,&local_150,&local_1a8,(ImVec2 *)&local_1c8,(float *)local_160,
                   &local_168.x,&local_f0.x);
        fVar23 = 1.0 - local_168.x;
        fVar38 = 1.0;
        if (fVar23 <= 1.0) {
          fVar38 = fVar23;
        }
        local_20c = (float)(-(uint)(fVar23 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar23 < 0.0001) & (uint)fVar38);
        fVar23 = (float)local_160._0_4_ / local_20c;
        fVar38 = 1.0;
        if (fVar23 <= 1.0) {
          fVar38 = fVar23;
        }
        local_214 = (float)(-(uint)(fVar23 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar23 < 0.0001) & (uint)fVar38);
        uVar16 = (undefined7)((ulong)extraout_RAX >> 8);
        local_128._0_4_ = (int)CONCAT71(uVar16,1);
        out_r = local_170;
        local_1d8._0_4_ = (uint)CONCAT71(uVar16,1);
      }
      else {
        auVar26._12_4_ = 0;
        auVar26._0_12_ = local_128._4_12_;
        local_128 = auVar26 << 0x20;
        local_1d8._0_4_ = uVar21;
      }
    }
    else {
      auVar37._12_4_ = 0;
      auVar37._0_12_ = local_128._4_12_;
      local_128 = auVar37 << 0x20;
      uVar21 = 0;
      local_1d8._0_4_ = 0;
    }
    if ((uVar19 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_118._0_4_ = (float)local_118._0_4_ + (float)local_208._0_4_;
  if (local_1b0 == 0x10000) {
    local_1c8.y = (float)local_1e8._4_4_;
    local_1c8.x = (float)local_118._0_4_;
    SetCursorScreenPos((ImVec2 *)&local_1c8);
    local_1c8.y = local_198;
    local_1c8.x = local_148;
    InvisibleButton("alpha",(ImVec2 *)&local_1c8);
    bVar20 = IsItemActive();
    if (bVar20) {
      fVar23 = (*(float *)((long)local_188 + 0x134) - (float)local_1e8._4_4_) / (local_198 + -1.0);
      fVar38 = 1.0;
      if (fVar23 <= 1.0) {
        fVar38 = fVar23;
      }
      out_r[1].y = (float)(-(uint)(fVar23 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar23 < 0.0) & (uint)(1.0 - fVar38));
      local_1d8._0_4_ = (undefined4)CONCAT71(local_188._1_7_,1);
    }
  }
  PopItemFlag();
  if ((uVar19 >> 8 & 1) == 0) {
    SameLine(0.0,((ImVec2 *)((long)local_188 + 0x159c))->x);
    BeginGroup();
  }
  if ((-1 < (char)uVar19) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar19 >> 8 & 1) != 0) {
      SameLine(0.0,((ImVec2 *)((long)local_188 + 0x159c))->x);
    }
    TextUnformatted(label,text_end);
  }
  fVar38 = local_148 * 0.2;
  fVar23 = 0.0;
  fVar40 = 0.0;
  fVar39 = 0.0;
  local_60 = __n;
  if ((uVar19 >> 8 & 1) == 0) {
    local_108 = (ImVec2 *)(ulong)(uint)(local_148 * 0.2);
    fStack_100 = 0.0;
    fStack_fc = 0.0;
    PushItemFlag(0x10,true);
    local_1c8._0_8_ = *out_r;
    if ((uVar19 & 2) == 0) {
      local_1c8.w = out_r[1].y;
    }
    else {
      local_1c8.w = 1.0;
    }
    __src = local_e8._0_8_;
    local_1c8.z = out_r[1].x;
    if ((char)uVar19 < '\0') {
      Text("Current");
    }
    IVar24.x = local_148 * 3.0;
    IVar24.y = local_148 * 2.0;
    local_e8._8_4_ = local_148 * 0.0;
    local_e8._0_4_ = IVar24.x;
    local_e8._4_4_ = IVar24.y;
    local_e8._12_4_ = local_148 * 0.0;
    ColorButton("##current",&local_1c8,uVar19 & 0xe0040,IVar24);
    out_r = local_170;
    if ((ImVec2 *)__src != (ImVec2 *)0x0) {
      Text("Original");
      local_160 = *(undefined1 (*) [8])__src;
      if ((uVar19 & 2) == 0) {
        local_158.y = ((ImVec2 *)(__src + 8))->y;
      }
      else {
        local_158.y = 1.0;
      }
      local_158.x = ((ImVec2 *)(__src + 8))->x;
      bVar20 = ColorButton("##original",(ImVec4 *)local_160,uVar19 & 0xe0040,(ImVec2)local_e8._0_8_)
      ;
      out_r = local_170;
      if (bVar20) {
        pvVar15 = memcpy(local_170,(void *)__src,__n);
        local_1d8._0_4_ = (undefined4)CONCAT71((int7)((ulong)pvVar15 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
    fVar38 = (float)local_108;
    fVar23 = local_108._4_4_;
    fVar40 = fStack_100;
    fVar39 = fStack_fc;
  }
  out_b = out_r + 1;
  if (((char)uVar21 != '\0') ||
     (iVar14 = (int)fVar38, iVar22 = (int)fVar23, iVar27 = (int)fVar40, iVar28 = (int)fVar39,
     local_128[0] != '\0')) {
    local_e8._4_4_ = (int)fVar23;
    local_e8._0_4_ = (int)fVar38;
    local_e8._8_4_ = (int)fVar40;
    local_e8._12_4_ = (int)fVar39;
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= local_218) & (uint)local_218 |
                      (uint)(local_218 + -1e-05) & -(uint)(1.0 <= local_218)),
               (float)(~-(uint)(0.0 < local_214) & 0x3727c5ac |
                      (uint)local_214 & -(uint)(0.0 < local_214)),
               (float)(~-(uint)(0.0 < local_20c) & 0x358637bd |
                      (uint)local_20c & -(uint)(0.0 < local_20c)),&out_r->x,&out_r->y,&out_b->x);
    iVar14 = local_e8._0_4_;
    iVar22 = local_e8._4_4_;
    iVar27 = local_e8._8_4_;
    iVar28 = local_e8._12_4_;
  }
  local_98._4_4_ = (float)iVar22;
  local_98._0_4_ = (float)iVar14;
  fStack_90 = (float)iVar27;
  fStack_8c = (float)iVar28;
  if ((uVar19 & 0x20) == 0) {
    fVar38 = (float)local_118._0_4_;
    if (local_1b0 != 0x10000) {
      fVar38 = (float)local_1f8._0_4_;
    }
    PushItemWidth((fVar38 + local_148) - local_1ac);
    uVar11 = uVar19 & 0x18e001a;
    local_108 = out_b;
    if ((((uVar19 >> 0x14 & 1) == 0 && (uVar19 & 0x600000) != 0) ||
        (bVar20 = ColorEdit4("##rgb",&out_r->x,uVar11 | 0x100004), !bVar20)) ||
       (local_1d8._0_4_ = (undefined4)CONCAT71(extraout_var,1),
       *(ImGuiID *)((long)local_188 + 0x1a24) == 0)) {
      bVar17 = 0;
    }
    else {
      bVar17 = *(bool *)((long)local_188 + 0x1a35) ^ 1;
    }
    if ((uVar19 >> 0x15 & 1) != 0 || (uVar19 & 0x500000) == 0) {
      bVar20 = ColorEdit4("##hsv",&out_r->x,uVar11 | 0x200004);
      local_1d8._0_4_ = CONCAT31(SUB43(local_1d8._0_4_,1),(byte)local_1d8._0_4_ | bVar20);
    }
    if ((uVar19 >> 0x16 & 1) != 0 || (uVar19 & 0x300000) == 0) {
      bVar20 = ColorEdit4("##hex",&out_r->x,uVar11 | 0x400004);
      local_1d8._0_4_ = CONCAT31(SUB43(local_1d8._0_4_,1),(byte)local_1d8._0_4_ | bVar20);
    }
    PopItemWidth();
    if (bVar17 != 0) {
      ColorConvertRGBtoHSV
                (out_r->x,out_r->y,out_r[1].x,&local_1c8.x,(float *)local_160,&local_168.x);
      if ((local_1c8.x <= 0.0) && (0.0 < local_218)) {
        if (0.0 < local_168.x) {
LAB_001465a8:
          if (0.0 < (float)local_160._0_4_) goto LAB_001465cb;
          fVar38 = local_214 * 0.5;
        }
        else {
          if ((local_20c == local_168.x) && (!NAN(local_20c) && !NAN(local_168.x)))
          goto LAB_001465a8;
          local_168.x = local_20c * 0.5;
          fVar38 = local_214;
        }
        ColorConvertHSVtoRGB(local_218,fVar38,local_168.x,&out_r->x,&out_r->y,&local_108->x);
      }
    }
  }
LAB_001465cb:
  local_1c8.x = 1.0;
  local_1c8.y = 1.0;
  local_1c8.z = 1.0;
  local_1c8.w = 1.0;
  ColorConvertHSVtoRGB
            (local_218,1.0,1.0,&local_1c8.x,(float *)((long)&local_1c8 + 4),
             (float *)((long)&local_1c8 + 8));
  IVar12 = ColorConvertFloat4ToU32(&local_1c8);
  local_160 = *(undefined1 (*) [8])out_r;
  local_158.y = 1.0;
  local_158.x = out_r[1].x;
  IVar13 = ColorConvertFloat4ToU32((ImVec4 *)local_160);
  this = local_f8;
  local_168.x = 0.0;
  local_168.y = 0.0;
  if ((uVar19 >> 0x1a & 1) == 0) {
    if ((uVar19 >> 0x19 & 1) == 0) goto LAB_00146f19;
    local_c8._0_4_ = IVar13;
    local_160._4_4_ = (float)local_1e8._4_4_ + local_198;
    local_160._0_4_ = local_78;
    ImDrawList::AddRectFilledMultiColor
              (local_f8,&local_130,(ImVec2 *)local_160,0xffffffff,IVar12,IVar12,0xffffffff);
    local_1e8._4_4_ = local_198;
    local_1e8._0_4_ = local_198;
    fStack_1e0 = local_198;
    fStack_1dc = local_198;
    local_160._0_4_ = local_130.x + local_198;
    local_160._4_4_ = local_130.y + local_198;
    ImDrawList::AddRectFilledMultiColor
              (this,&local_130,(ImVec2 *)local_160,0,0,0xff000000,0xff000000);
    p_max.x = (float)local_1e8._0_4_ + local_130.x;
    p_max.y = (float)local_1e8._4_4_ + local_130.y;
    RenderFrameBorder(local_130,p_max,0.0);
    auVar35._4_4_ = 1.0 - local_20c;
    auVar35._0_4_ = local_214;
    auVar35._8_8_ = 0;
    auVar37 = minps(_DAT_0018c540,auVar35);
    fVar38 = local_130.x;
    fVar23 = local_130.y;
    auVar32._0_4_ =
         (float)(int)((float)(-(uint)(0.0 <= local_214) & auVar37._0_4_) * (float)local_1e8._0_4_ +
                      fVar38 + 0.5);
    auVar32._4_4_ =
         (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_20c) & auVar37._4_4_) *
                      (float)local_1e8._4_4_ + fVar23 + 0.5);
    auVar32._8_4_ = (float)(int)(auVar37._8_4_ * fStack_1e0 + 0.0 + 0.0);
    auVar32._12_4_ = (float)(int)(auVar37._12_4_ * fStack_1dc + 0.0 + 0.0);
    auVar36._0_4_ = (float)local_1e8._0_4_ + fVar38 + -2.0;
    auVar36._4_4_ = (float)local_1e8._4_4_ + fVar23 + -2.0;
    auVar36._8_4_ = fStack_1e0 + 0.0 + 0.0;
    auVar36._12_4_ = fStack_1dc + 0.0 + 0.0;
    auVar37 = minps(auVar36,auVar32);
    uVar19 = -(uint)(auVar32._0_4_ < fVar38 + 2.0);
    uVar21 = -(uint)(auVar32._4_4_ < fVar23 + 2.0);
    local_168 = (ImVec2)(CONCAT44(~uVar21 & auVar37._4_4_,~uVar19 & auVar37._0_4_) |
                        CONCAT44((uint)(fVar23 + 2.0) & uVar21,(uint)(fVar38 + 2.0) & uVar19));
    local_1e8._4_4_ = fStack_194;
    local_1e8._0_4_ = local_198 / 6.0;
    fStack_1e0 = (float)uStack_190;
    fStack_1dc = (float)uStack_18c;
    lVar18 = 0;
    IVar13 = 0xff0000ff;
    do {
      local_160._4_4_ = (float)(int)lVar18 * (float)local_1e8._0_4_ + local_130.y;
      local_160._0_4_ = local_1f8._0_4_;
      lVar1 = lVar18 + 1;
      local_f0.y = (float)(int)lVar1 * (float)local_1e8._0_4_ + local_130.y;
      local_f0.x = (float)local_208._0_4_;
      IVar12 = (&DAT_00194194)[lVar18];
      ImDrawList::AddRectFilledMultiColor
                (this,(ImVec2 *)local_160,&local_f0,IVar13,IVar13,IVar12,IVar12);
      lVar18 = lVar1;
      IVar13 = IVar12;
    } while (lVar1 != 6);
    _local_1e8 = ZEXT416((uint)(float)(int)(local_218 * local_198 + local_130.y + 0.5));
    p_min.y = local_130.y;
    p_min.x = (float)local_1f8._0_4_;
    p_max_00.y = local_198 + local_130.y;
    p_max_00.x = (float)local_208._0_4_;
    RenderFrameBorder(p_min,p_max_00,0.0);
    pos.x = (float)local_1f8._0_4_ + -1.0;
    pos.y = (float)local_1e8._0_4_;
    half_sz.x = (float)local_98._0_4_ + 1.0;
    half_sz.y = (float)local_98._0_4_;
    RenderArrowsForVerticalBar(this,pos,half_sz,local_148 + 2.0);
  }
  else {
    local_c8._0_4_ = IVar13;
    local_1ac = 5.60519e-45;
    if (4 < (int)(float)local_88._0_4_ / 0xc) {
      local_1ac = (float)((int)(float)local_88._0_4_ / 0xc);
    }
    local_e8 = ZEXT416((uint)(1.5 / (float)local_88._0_4_));
    local_78 = -(1.5 / (float)local_88._0_4_);
    fStack_74 = -0.0;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    local_88._0_4_ = (float)local_88._0_4_ + (float)local_b8._0_4_;
    local_108 = (ImVec2 *)CONCAT44(local_108._4_4_,(float)local_88._0_4_ * 0.5);
    local_b8._4_4_ = local_b8._0_4_;
    fStack_b0 = (float)local_b8._0_4_;
    fStack_ac = (float)local_b8._0_4_;
    lVar18 = 0;
    local_d0 = IVar12;
    local_cc = uVar21;
    do {
      fVar38 = (float)(int)lVar18 / 6.0;
      fVar38 = (fVar38 + fVar38) * 3.1415927 + local_78;
      local_188.x = fVar38;
      fVar23 = ((float)(int)lVar18 + 1.0) / 6.0;
      fVar23 = (fVar23 + fVar23) * 3.1415927 + (float)local_e8._0_4_;
      local_1e8._0_4_ = fVar23;
      iVar14 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1b8,(float)local_108,fVar38,fVar23,(int)local_1ac);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,0xffffffff,false,local_210)
      ;
      (this->_Path).Size = 0;
      iVar22 = (this->VtxBuffer).Size;
      _local_1f8 = ZEXT416((uint)local_1b8.x);
      local_208._0_4_ = cosf(local_188.x);
      local_208._4_4_ = extraout_XMM0_Db_02;
      fStack_200 = (float)extraout_XMM0_Dc_02;
      fStack_1fc = (float)extraout_XMM0_Dd_02;
      auVar33._4_4_ = local_1b8.y;
      auVar33._0_4_ = local_1f8._0_4_;
      auVar33._8_4_ = local_1f8._4_4_;
      auVar33._12_4_ = 0;
      _local_1f8 = auVar33;
      fVar38 = sinf(local_188.x);
      fVar23 = (float)local_208._4_4_ * fStack_b0;
      local_208._4_4_ = fVar38 * (float)local_b8._4_4_ + (float)local_1f8._4_4_;
      local_208._0_4_ = (float)local_208._0_4_ * (float)local_b8._0_4_ + (float)local_1f8._0_4_;
      fStack_200 = fVar23 + fStack_1f0;
      fStack_1fc = extraout_XMM0_Db_03 * fStack_ac + fStack_1ec;
      _local_1f8 = ZEXT416((uint)local_1b8.x);
      local_188.x = cosf((float)local_1e8._0_4_);
      local_188.y = extraout_XMM0_Db_04;
      auVar34._4_4_ = local_1b8.y;
      auVar34._0_4_ = local_1f8._0_4_;
      auVar34._8_4_ = local_1f8._4_4_;
      auVar34._12_4_ = 0;
      _local_1f8 = auVar34;
      fVar38 = sinf((float)local_1e8._0_4_);
      gradient_p1.x = local_188.x * (float)local_b8._0_4_ + (float)local_1f8._0_4_;
      gradient_p1.y = fVar38 * (float)local_b8._4_4_ + (float)local_1f8._4_4_;
      lVar1 = lVar18 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar14,iVar22,(ImVec2)local_208,gradient_p1,(&DAT_00194190)[lVar18],
                 (&DAT_00194194)[lVar18]);
      lVar18 = lVar1;
    } while (lVar1 != 6);
    local_208._0_4_ = cosf((local_218 + local_218) * 3.1415927);
    local_208._4_4_ = extraout_XMM0_Db_05;
    fStack_200 = (float)extraout_XMM0_Dc_03;
    fStack_1fc = (float)extraout_XMM0_Dd_03;
    local_1f8._0_4_ = sinf((local_218 + local_218) * 3.1415927);
    IVar13 = local_d0;
    this = local_f8;
    local_1f8._4_4_ = extraout_XMM0_Db_06;
    fStack_1f0 = (float)extraout_XMM0_Dc_04;
    fStack_1ec = (float)extraout_XMM0_Dd_04;
    local_160._0_4_ = (float)local_208._0_4_ * (float)local_88._0_4_ * 0.5 + local_1b8.x;
    local_160._4_4_ = (float)local_1f8._0_4_ * (float)local_88._0_4_ * 0.5 + local_1b8.y;
    if ((char)local_cc == '\0') {
      fVar38 = 0.55;
    }
    else {
      fVar38 = 0.65;
    }
    local_210 = local_210 * fVar38;
    iVar14 = 0x20;
    if ((int)(local_210 / 1.4) < 0x20) {
      iVar14 = (int)(local_210 / 1.4);
    }
    iVar22 = 9;
    if (9 < iVar14) {
      iVar22 = iVar14;
    }
    ImDrawList::AddCircleFilled(local_f8,(ImVec2 *)local_160,local_210,local_d0,iVar22);
    ImDrawList::AddCircle(this,(ImVec2 *)local_160,local_210 + 1.0,0xff808080,iVar22,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_160,local_210,0xffffffff,iVar22,1.0);
    uVar9 = local_1f8._0_4_;
    uVar10 = local_1f8._4_4_;
    uVar7 = local_208._0_4_;
    uVar8 = local_208._4_4_;
    fVar38 = (float)local_208._4_4_ * 0.0;
    fVar23 = (float)local_208._4_4_ * 0.0;
    local_1e8._0_4_ = local_1b8.x;
    local_f0.x = local_1a0.x * (float)local_208._0_4_ + -local_1a0.y * (float)local_1f8._0_4_ +
                 (float)local_1e8._0_4_;
    local_1e8._4_4_ = local_1b8.y;
    local_f0.y = local_1a0.x * (float)local_1f8._0_4_ + local_1a0.y * (float)local_208._0_4_ +
                 (float)local_1e8._4_4_;
    local_208._4_4_ = local_f0.y;
    local_208._0_4_ = local_f0.x;
    fStack_200 = (float)local_1f8._4_4_ * 0.0 + (float)local_1f8._4_4_ * -0.0 + 0.0;
    fStack_1fc = fVar23 + fVar38 + 0.0;
    fVar38 = (float)local_1f8._4_4_ * -0.0;
    fVar40 = (float)local_1f8._4_4_ * 0.0;
    fVar23 = local_150.x * (float)uVar7 + -local_150.y * (float)local_1f8._0_4_ +
             (float)local_1e8._0_4_;
    local_1f8._4_4_ =
         local_150.x * (float)local_1f8._0_4_ + local_150.y * (float)uVar7 + (float)local_1e8._4_4_;
    local_1f8._0_4_ = fVar23;
    fStack_1f0 = fVar40 + fVar38 + 0.0;
    fStack_1ec = (float)uVar8 * 0.0 + (float)uVar8 * 0.0 + 0.0;
    local_38.y = (float)local_1f8._4_4_;
    local_38.x = fVar23;
    local_1e8._0_4_ =
         local_1a8.x * (float)uVar7 + -local_1a8.y * (float)uVar9 + (float)local_1e8._0_4_;
    local_1e8._4_4_ =
         local_1a8.x * (float)uVar9 + local_1a8.y * (float)uVar7 + (float)local_1e8._4_4_;
    fStack_1e0 = (float)uVar10 * 0.0 + (float)uVar10 * -0.0 + 0.0;
    fStack_1dc = (float)uVar8 * 0.0 + (float)uVar8 * 0.0 + 0.0;
    local_40.y = (float)local_1e8._4_4_;
    local_40.x = (float)local_1e8._0_4_;
    local_188 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(this,6,6);
    auVar5 = _local_1e8;
    auVar26 = _local_1f8;
    auVar37 = _local_208;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->pos).x = (float)local_208._0_4_;
    (pIVar3->pos).y = (float)local_208._4_4_;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = IVar13;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1f8._0_4_;
    pIVar3[1].pos.y = (float)local_1f8._4_4_;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = IVar13;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1e8._0_4_;
    pIVar3[1].pos.y = (float)local_1e8._4_4_;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xffffffff;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_208._0_4_;
    pIVar3[1].pos.y = (float)local_208._4_4_;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos.x = (float)local_1f8._0_4_;
    pIVar3[1].pos.y = (float)local_1f8._4_4_;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xff000000;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar19 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar19;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar19;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_40;
    this->_VtxWritePtr->uv = local_188;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_208 = auVar37;
    _local_1f8 = auVar26;
    _local_1e8 = auVar5;
    ImDrawList::AddTriangle(this,&local_f0,&local_38,&local_40,0xff808080,1.5);
    fVar38 = 1.0;
    if (local_214 <= 1.0) {
      fVar38 = local_214;
    }
    fVar38 = (float)(~-(uint)(local_214 < 0.0) & (uint)fVar38);
    fVar40 = 1.0 - local_20c;
    fVar23 = 1.0;
    if (fVar40 <= 1.0) {
      fVar23 = fVar40;
    }
    fVar23 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar23);
    fVar40 = fVar38 * (local_f0.x - local_40.x) + local_40.x;
    fVar38 = fVar38 * (local_f0.y - local_40.y) + local_40.y;
    local_168.x = fVar23 * (local_38.x - fVar40) + fVar40;
    local_168.y = fVar23 * (local_38.y - fVar38) + fVar38;
  }
  out_r = local_170;
  IVar13 = local_c8._0_4_;
LAB_00146f19:
  if (local_128[0] == '\0') {
    fVar38 = 6.0;
  }
  else {
    fVar38 = 10.0;
  }
  local_208._0_4_ = fVar38;
  ImDrawList::AddCircleFilled(this,&local_168,fVar38,IVar13,0xc);
  ImDrawList::AddCircle(this,&local_168,(float)local_208._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,&local_168,(float)local_208._0_4_,0xffffffff,0xc,1.0);
  if (local_1b0 == 0x10000) {
    fVar38 = out_r[1].y;
    _local_1f8 = ZEXT416((uint)fVar38);
    fVar23 = 1.0;
    if (fVar38 <= 1.0) {
      fVar23 = fVar38;
    }
    _local_208 = ZEXT416((uint)(1.0 - fVar23));
    local_160._4_4_ = local_130.y;
    local_160._0_4_ = local_118._0_4_;
    local_158.x = (float)local_118._0_4_ + local_148;
    local_158.y = local_130.y + local_198;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_160,local_158,0,(local_158.x - (float)local_118._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_160,&local_158,IVar13,IVar13,IVar13 & 0xffffff,IVar13 & 0xffffff
              );
    local_208._4_4_ = (float)(int)(float)(~local_1f8._4_4_ & local_208._4_4_);
    local_208._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1f8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1f8._0_4_ < 0.0) & local_208._0_4_) * local_198 +
                      local_130.y + 0.5);
    fStack_200 = (float)(int)(float)(~(uint)fStack_1f0 & (uint)fStack_200);
    fStack_1fc = (float)(int)(float)(~(uint)fStack_1ec & (uint)fStack_1fc);
    RenderFrameBorder((ImVec2)local_160,local_158,0.0);
    pos_00.x = (float)local_118._0_4_ + -1.0;
    pos_00.y = (float)local_208._0_4_;
    half_sz_00.x = (float)local_98._0_4_ + 1.0;
    half_sz_00.y = (float)local_98._0_4_;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_148 + 2.0);
  }
  EndGroup();
  uVar7 = local_1d8._0_4_;
  uVar19 = local_1d8._0_4_;
  if ((char)local_1d8._0_4_ != '\0') {
    iVar14 = bcmp(local_58,out_r,local_60);
    uVar19 = uVar7 & 0xff;
    if (iVar14 == 0) {
      uVar19 = 0;
    }
  }
  if ((uVar19 & 1) != 0) {
    MarkItemEdited((local_a0->DC).LastItemId);
  }
  PopID();
  return (bool)((byte)uVar19 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}